

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O0

void __thiscall chatra::emb::io::IoPackageInterface::~IoPackageInterface(IoPackageInterface *this)

{
  IoPackageInterface *this_local;
  
  ~IoPackageInterface(this);
  operator_delete(this);
  return;
}

Assistant:

std::vector<uint8_t> saveNativePtr(PackageContext& pct, INativePtr* ptr) override {
		(void)pct;
		std::vector<uint8_t> buffer;

		auto* data = static_cast<NativeData*>(ptr);
		writeInt(buffer, static_cast<uint64_t>(data->type));

		auto* fs = static_cast<IFileSystem*>(pct.getDriver(DriverType::FileSystem));
		switch (data->type) {
		case Type::FileInputStream: {
			auto* self = static_cast<FileInputStreamData*>(ptr);
			auto fileData = fs->saveFile(self->file.get());
			buffer.insert(buffer.cend(), fileData.cbegin(), fileData.cend());
			break;
		}
		case Type::FileOutputStream: {
			auto* self = static_cast<FileOutputStreamData*>(ptr);
			auto fileData = fs->saveFile(self->file.get());
			buffer.insert(buffer.cend(), fileData.cbegin(), fileData.cend());
			break;
		}
		}
		return buffer;
	}